

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

void __thiscall branch_and_reduce_algorithm::get_stcut_vertices(branch_and_reduce_algorithm *this)

{
  vector<int,_std::allocator<int>_> *partition_index;
  pointer piVar1;
  pointer ppVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  pointer ppVar9;
  long lVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  int u;
  int id;
  int v;
  vector<int,_std::allocator<int>_> vc;
  vector<int,_std::allocator<int>_> reverseMapping;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges;
  _Vector_base<int,_std::allocator<int>_> local_218;
  vector<int,_std::allocator<int>_> mapping;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  biGraph;
  vector<int,_std::allocator<int>_> U;
  vector<int,_std::allocator<int>_> V;
  max_flow_algo flow_algo;
  
  piVar5 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if ((this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
  }
  iVar3 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar3] = 0;
  iVar4 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar3] = -1;
  this->s = iVar3;
  this->t = iVar4;
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  max_flow_algo::max_flow_algo(&flow_algo,&this->adj,&this->x);
  partition_index = &this->partition_index;
  piVar1 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
    *piVar5 = 1;
  }
  max_flow_algo::solve_max_flow_min_cut
            (&flow_algo,this->rn,this->s,this->t,true,
             (vector<int,_std::allocator<int>_> *)&local_218,true,&edges,partition_index);
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,(long)this->n,(value_type_conflict1 *)&reverseMapping,(allocator_type *)&U);
  ppVar2 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = 0;
  for (ppVar9 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    u = ppVar9->first;
    v = ppVar9->second;
    if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[u] == -1) {
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [u] = id;
      std::vector<int,_std::allocator<int>_>::push_back(&reverseMapping,&u);
      std::vector<int,_std::allocator<int>_>::push_back(&U,&id);
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&biGraph,
                 (vector<int,_std::allocator<int>_> *)
                 &vc.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vc.super__Vector_base<int,_std::allocator<int>_>);
      id = id + 1;
    }
    lVar7 = (long)v;
    if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar7] == -1) {
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar7] = id;
      std::vector<int,_std::allocator<int>_>::push_back(&reverseMapping,&v);
      std::vector<int,_std::allocator<int>_>::push_back(&V,&id);
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&biGraph,
                 (vector<int,_std::allocator<int>_> *)
                 &vc.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vc.super__Vector_base<int,_std::allocator<int>_>);
      id = id + 1;
      lVar7 = (long)v;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (biGraph.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[u],
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start + lVar7);
    std::vector<int,_std::allocator<int>_>::push_back
              (biGraph.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[v],
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start + u);
  }
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  hc_karp(&biGraph,&U,&V,&vc);
  piVar5 = (partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = 0;
      (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2 != lVar7; lVar7 = lVar7 + 1) {
    iVar3 = reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7]];
    vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar7]
         = iVar3;
    piVar5[iVar3] = 2;
  }
  for (u = 0; uVar8 = (ulong)u,
      uVar8 < (ulong)(((long)(this->adj).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->adj).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); u = u + 1) {
    if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar8] < 0) &&
       ((partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar8] == 2)) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->cut,&u);
    }
  }
  lVar7 = (long)local_218._M_impl.super__Vector_impl_data._M_finish -
          (long)local_218._M_impl.super__Vector_impl_data._M_start;
  sVar6 = number_of_nodes_remaining(this);
  uVar8 = TUNING_PARAM1;
  if (TUNING_PARAM1 < 0) {
    uVar8 = (ulong)(uint)(int)((double)this->rn * ((double)-TUNING_PARAM1 / 100.0));
  }
  piVar5 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar1 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((uVar8 & 0xffffffff) < (ulong)((long)piVar1 - (long)piVar5 >> 2)) {
    if (piVar1 == piVar5) goto LAB_0010fdd5;
  }
  else if ((piVar1 == piVar5) ||
          (lVar10 = lVar7 >> 2, auVar11._8_4_ = (int)(lVar7 >> 0x22), auVar11._0_8_ = lVar10,
          auVar11._12_4_ = 0x45300000, auVar13._8_4_ = (int)(sVar6 >> 0x20), auVar13._0_8_ = sVar6,
          auVar13._12_4_ = 0x45300000,
          dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)),
          dVar12 <= 1.0 - TUNING_PARAM2 && TUNING_PARAM2 <= dVar12)) goto LAB_0010fdd5;
  (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar5;
LAB_0010fdd5:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vc.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&biGraph);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&V.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&U.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&reverseMapping.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mapping.super__Vector_base<int,_std::allocator<int>_>);
  max_flow_algo::~max_flow_algo(&flow_algo);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_218);
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_stcut_vertices()
{
    cut.clear();
    // choose s and t with max deg
    NodeID v1 = get_max_deg_vtx();
    x[v1] = 0;
    NodeID v2 = get_max_deg_vtx();
    x[v1] = -1;

    s = v1;
    t = v2;

    std::vector<int> res = {};
    std::vector<std::pair<int, int>> edges;

    max_flow_algo flow_algo(adj, x);
    std::fill (partition_index.begin(), partition_index.end(), 1);
    int s2 = flow_algo.solve_max_flow_min_cut(rn, s, t, true, res, true, edges, partition_index);

    std::vector<int> mapping(n, -1);
    std::vector<int> reverseMapping;
    std::vector<int> U, V;
    std::vector<std::vector<int>> biGraph;

    int id = 0;
    for (auto edge : edges)
    {
        int u = edge.first;
        int v = edge.second;
        if (mapping[u] == -1)
        {
            mapping[u] = id;
            reverseMapping.push_back(u);
            U.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }
        if (mapping[v] == -1)
        {
            mapping[v] = id;
            reverseMapping.push_back(v);
            V.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }

        biGraph[mapping[u]].push_back(mapping[v]);
        biGraph[mapping[v]].push_back(mapping[u]);
    }

    std::vector<int> vc;
    hc_karp(biGraph, U, V, vc);
    for (int i = 0; i < vc.size(); i++)
    {
        vc[i] = reverseMapping[vc[i]];
        partition_index[vc[i]] = 2;
    }

    for (int i = 0; i < adj.size(); ++i)
    {
        if (x[i] < 0 && partition_index[i] == 2)
            cut.push_back(i);
    }

    double perc = (double)res.size() / (double)number_of_nodes_remaining();
    unsigned int max_size = TUNING_PARAM1 >= 0 ? TUNING_PARAM1 : (int)((((double)(-TUNING_PARAM1)) / 100) * (double)rn);
    if (cut.size() > max_size || perc < TUNING_PARAM2 || perc > (1.0 - TUNING_PARAM2))
    {
        // to big, use max. deg. vertex instead
        cut.clear();
    }
}